

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_DeprecatedFunctionsTest_ReadFromFlagsFile::Run(void)

{
  bool bVar1;
  char *pcVar2;
  allocator local_51;
  FlagSaver fs;
  string filename;
  string local_28;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","DeprecatedFunctionsTest","ReadFromFlagsFile");
  fLI::FLAGS_test_int32 = -10;
  std::__cxx11::string::string((string *)&local_28,"flagfile2",&local_51);
  TmpFile(&filename,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  unlink(filename._M_dataplus._M_p);
  pcVar2 = GetArgv0();
  bVar1 = AppendFlagsIntoFile(&filename,pcVar2);
  if (bVar1) {
    fLI::FLAGS_test_int32 = -0xb;
    pcVar2 = GetArgv0();
    bVar1 = ReadFromFlagsFile(&filename,pcVar2,true);
    if (bVar1) {
      if (fLI::FLAGS_test_int32 == -10) {
        std::__cxx11::string::~string((string *)&filename);
        FlagSaver::~FlagSaver(&fs);
        return;
      }
      fprintf(_stderr,"Check failed: %s %s %s\n","-10","==","FLAGS_test_int32");
      goto LAB_00138afe;
    }
  }
  fprintf(_stderr,"Check failed: %s\n","r");
LAB_00138afe:
  exit(1);
}

Assistant:

TEST(DeprecatedFunctionsTest, ReadFromFlagsFile) {
  FLAGS_test_int32 = -10;    // just to make the test more interesting
  string filename(TmpFile("flagfile2"));
  unlink(filename.c_str());  // just to be safe
  bool r = AppendFlagsIntoFile(filename, GetArgv0());
  EXPECT_TRUE(r);

  FLAGS_test_int32 = -11;
  r = ReadFromFlagsFile(filename, GetArgv0(), true);
  EXPECT_TRUE(r);
  EXPECT_EQ(-10, FLAGS_test_int32);
}